

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  significand_type *psVar1;
  long lVar2;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar3;
  appender aVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char cVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  sign_t sVar15;
  int iVar16;
  uint uVar17;
  float_specs fVar18;
  int iVar19;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_eb [31];
  undefined1 local_cc [8];
  int iStack_c4;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  char local_a8;
  ulong local_a0;
  void *local_98;
  basic_format_specs<char> *local_90;
  float_specs local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  int local_68;
  char cStack_64;
  undefined3 uStack_63;
  undefined8 local_60;
  digit_grouping<char> *local_58;
  digit_grouping<char> *local_50;
  int *local_48;
  int *local_40;
  char *local_38;
  
  psVar1 = (significand_type *)f->significand;
  lVar11 = 0x3f;
  if (((ulong)psVar1 | 1) != 0) {
    for (; ((ulong)psVar1 | 1) >> lVar11 == 0; lVar11 = lVar11 + -1) {
    }
  }
  iVar19 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar11] -
           (uint)(psVar1 < *(significand_type **)
                            (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                            (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar11] * 8));
  local_eb[2] = 0x30;
  sVar15 = fspecs._5_1_;
  uVar14 = (ulong)((iVar19 + 1) - (uint)(sVar15 == none));
  uVar9 = fspecs._4_4_;
  local_eb[0] = '.';
  fVar18 = fspecs;
  local_eb[1] = sVar15;
  local_eb._7_4_ = iVar19;
  local_eb._19_8_ = psVar1;
  local_80 = (undefined1  [8])fspecs;
  if ((uVar9 >> 0x11 & 1) != 0) {
    local_a0 = uVar14;
    local_98 = loc.locale_;
    local_90 = specs;
    local_88 = fspecs;
    local_eb[0] = decimal_point_impl<char>(loc);
    specs = local_90;
    loc.locale_ = local_98;
    uVar14 = local_a0;
    fVar18 = local_88;
  }
  uVar17 = f->exponent;
  iVar7 = iVar19 + uVar17;
  iVar16 = fVar18.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_001218fc:
    iVar8 = iVar19 + uVar17 + -1;
    if ((uVar9 >> 0x13 & 1) == 0) {
      uVar12 = 0;
      if (iVar19 == 1) {
        local_eb[0] = '\0';
        uVar12 = 0;
      }
    }
    else {
      uVar12 = 0;
      if (0 < iVar16 - iVar19) {
        uVar12 = (ulong)(uint)(iVar16 - iVar19);
      }
      uVar14 = uVar14 + uVar12;
    }
    local_78[0] = sVar15;
    cStack_64 = local_eb[0];
    local_68 = iVar19;
    local_60._0_5_ = CONCAT14('0',(int)uVar12);
    local_60 = (decimal_fp<double> *)
               (CONCAT26(local_60._6_2_,
                         CONCAT15(((uVar9 >> 0x10 & 1) == 0) << 5,(undefined5)local_60)) |
               0x450000000000);
    local_58 = (digit_grouping<char> *)CONCAT44(local_58._4_4_,iVar8);
    local_78._8_8_ = psVar1;
    if (0 < specs->width) {
      if (iVar7 < 1) {
        iVar8 = 1 - iVar7;
      }
      lVar11 = 2;
      if (99 < iVar8) {
        lVar11 = (ulong)(999 < iVar8) + 3;
      }
      sVar5 = uVar14 + (3 - (ulong)(local_eb[0] == '\0')) + lVar11;
      aVar4 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,sVar5,sVar5,(anon_class_40_8_dbbf3351 *)local_78);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar4.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    aVar4 = do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<double>,_char,_fmt::v9::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()
                      ((anon_class_40_8_dbbf3351 *)local_78,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
    return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           aVar4.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar8 = 0x10;
    if (0 < iVar16) {
      iVar8 = iVar16;
    }
    if ((iVar7 < -3) || (iVar8 < iVar7)) goto LAB_001218fc;
  }
  local_eb._11_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  local_cc._0_4_ = iVar7;
  if ((int)uVar17 < 0) {
    if (iVar7 < 1) {
      iVar8 = -iVar7;
      local_cc._4_4_ = iVar8;
      if (SBORROW4(iVar16,iVar8) != iVar16 + iVar7 < 0) {
        local_cc._4_4_ = iVar16;
      }
      if (iVar16 < 0) {
        local_cc._4_4_ = iVar8;
      }
      if (iVar19 != 0) {
        local_cc._4_4_ = iVar8;
      }
      if (iVar19 == 0 && local_cc._4_4_ == 0) {
        local_eb[3] = (char)((uVar9 & 0x80000) >> 0x13);
        iVar19 = 1;
        if (((ulong)fspecs & 0x8000000000000) == 0) goto LAB_00121c67;
      }
      else {
        local_eb[3] = 1;
      }
      iVar19 = 2;
LAB_00121c67:
      sVar5 = (uint)(iVar19 + local_cc._4_4_) + uVar14;
      local_78._0_8_ = local_eb + 1;
      local_78._8_8_ = local_eb + 2;
      _local_68 = local_eb + 3;
      local_60 = (decimal_fp<double> *)local_eb;
      local_58 = (digit_grouping<char> *)(local_cc + 4);
      local_50 = (digit_grouping<char> *)(local_eb + 0x13);
      local_48 = (int *)(local_eb + 7);
      aVar4 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                        (out,specs,sVar5,sVar5,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar4.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    iVar7 = 0;
    local_eb._3_4_ = iVar16 - iVar19 & (int)(uVar9 << 0xc) >> 0x1f;
    uVar17 = local_eb._3_4_;
    if ((int)local_eb._3_4_ < 1) {
      uVar17 = 0;
    }
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)(local_cc + 4),loc,(bool)((byte)(uVar9 >> 0x11) & 1));
    if (local_a8 != '\0') {
      pcVar13 = (char *)CONCAT44(iStack_c4,local_cc._4_4_);
      pcVar6 = pcVar13 + local_c0;
      lVar11 = 0;
      do {
        if (pcVar13 == pcVar6) {
          cVar10 = pcVar6[-1];
          pcVar13 = pcVar6;
        }
        else {
          cVar10 = *pcVar13;
          if ((byte)(cVar10 + 0x81U) < 0x82) goto LAB_00121bc3;
          pcVar13 = pcVar13 + 1;
        }
        iVar7 = iVar7 + cVar10;
        if ((int)local_eb._7_4_ <= iVar7) goto LAB_00121bc3;
        lVar11 = lVar11 + 1;
      } while( true );
    }
    lVar11 = 0;
LAB_00121bc3:
    sVar5 = uVar17 + uVar14 + lVar11 + 1;
    local_78._0_8_ = local_eb + 1;
    local_78._8_8_ = local_eb + 0x13;
    _local_68 = local_eb + 7;
    local_60 = (decimal_fp<double> *)local_cc;
    local_58 = (digit_grouping<char> *)local_eb;
    local_48 = (int *)(local_eb + 3);
    local_40 = (int *)(local_eb + 2);
    local_50 = (digit_grouping<char> *)(local_cc + 4);
    bVar3.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                   ((appender)local_eb._11_8_,specs,sVar5,sVar5,(anon_class_64_8_e6ffa566 *)local_78
                   );
    goto LAB_00121c26;
  }
  lVar11 = uVar17 + uVar14;
  local_eb._3_4_ = iVar16 - iVar7;
  if ((uVar9 >> 0x13 & 1) != 0) {
    lVar11 = lVar11 + 1;
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_eb._3_4_) {
      if ((int)local_eb._3_4_ < 1) goto LAB_00121abf;
    }
    else {
      local_eb._3_4_ = 1;
    }
    lVar11 = lVar11 + (ulong)(uint)local_eb._3_4_;
  }
LAB_00121abf:
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)(local_cc + 4),loc,(bool)((byte)(uVar9 >> 0x11) & 1));
  iVar19 = 0;
  if (local_a8 != '\0') {
    pcVar13 = (char *)CONCAT44(iStack_c4,local_cc._4_4_);
    pcVar6 = pcVar13 + local_c0;
    lVar2 = 0;
    do {
      if (pcVar13 == pcVar6) {
        cVar10 = pcVar6[-1];
        pcVar13 = pcVar6;
      }
      else {
        cVar10 = *pcVar13;
        if ((byte)(cVar10 + 0x81U) < 0x82) goto LAB_00121b2d;
        pcVar13 = pcVar13 + 1;
      }
      iVar19 = iVar19 + cVar10;
      if (iVar7 <= iVar19) goto LAB_00121b2d;
      lVar2 = lVar2 + 1;
    } while( true );
  }
  lVar2 = 0;
LAB_00121b2d:
  local_78._0_8_ = local_eb + 1;
  local_78._8_8_ = local_eb + 0x13;
  _local_68 = local_eb + 7;
  local_50 = (digit_grouping<char> *)local_80;
  local_48 = (int *)local_eb;
  local_40 = (int *)(local_eb + 3);
  local_38 = local_eb + 2;
  local_60 = f;
  local_58 = (digit_grouping<char> *)(local_cc + 4);
  bVar3.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                 ((appender)local_eb._11_8_,specs,lVar11 + lVar2,lVar11 + lVar2,
                  (anon_class_72_9_0c6a3a8a *)local_78);
LAB_00121c26:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iStack_c4,local_cc._4_4_) != &local_b8) {
    operator_delete((undefined1 *)CONCAT44(iStack_c4,local_cc._4_4_),
                    local_b8._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}